

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedReadWriteCase1CS::Run(AdvancedReadWriteCase1CS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  void *pvVar3;
  undefined4 *puVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  GLint data [512];
  string local_838 [64];
  
  local_838[0]._M_dataplus._M_p = (pointer)&local_838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_838,
             "\nlayout(local_size_x = 128) in;\nstruct s {\n  int ene;\n  int due;\n  int like;\n  int fake;\n};\nlayout(std430) coherent buffer Buffer {\n  s a[128];\n} g_buffer;\nvoid main() {\n  g_buffer.a[gl_LocalInvocationIndex].due = g_buffer.a[gl_LocalInvocationIndex].ene;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].like = g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].due;\n  groupMemoryBarrier();\n  barrier();\n  g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].fake = g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].like;\n}"
             ,"");
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,local_838);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != &local_838[0].field_2) {
    operator_delete(local_838[0]._M_dataplus._M_p,local_838[0].field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar7 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    lVar7 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    puVar4 = (undefined4 *)((long)&local_838[0]._M_string_length + 4);
    do {
      puVar4[-3] = (uint)lVar7 | 0x100;
      *(undefined8 *)(puVar4 + -2) = 0;
      *puVar4 = 0;
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar7 != 0x80);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,local_838,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x800,1);
    lVar7 = -1;
    if (pvVar3 != (void *)0x0) {
      bVar5 = 1;
      lVar6 = 0;
      do {
        if (*(int *)((long)pvVar3 + lVar6 + 0xc) !=
            *(int *)((long)&local_838[0]._M_dataplus._M_p + lVar6)) {
          bVar5 = 0;
          anon_unknown_0::Output("Received: %d, but expected: %d -> %d -> %d\n");
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x800);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      puVar4 = (undefined4 *)((long)&local_838[0]._M_string_length + 4);
      lVar6 = 0;
      do {
        puVar4[-3] = (uint)lVar6 | 0x200;
        *(undefined8 *)(puVar4 + -2) = 0;
        *puVar4 = 0;
        lVar6 = lVar6 + 1;
        puVar4 = puVar4 + 4;
      } while (lVar6 != 0x80);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,local_838,0x88e8);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar3 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x800,1);
      if (pvVar3 != (void *)0x0) {
        lVar7 = 0;
        do {
          if (*(int *)((long)pvVar3 + lVar7 + 0xc) !=
              *(int *)((long)&local_838[0]._M_dataplus._M_p + lVar7)) {
            bVar5 = 0;
            anon_unknown_0::Output("Received: %d, but expected: %d\n");
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x800);
        lVar7 = -(ulong)(~bVar5 & 1);
      }
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		bool status = true;

		const char* const glsl_cs = NL
			"layout(local_size_x = 128) in;" NL "struct s {" NL "  int ene;" NL "  int due;" NL "  int like;" NL
			"  int fake;" NL "};" NL "layout(std430) coherent buffer Buffer {" NL "  s a[128];" NL "} g_buffer;" NL
			"void main() {" NL "  g_buffer.a[gl_LocalInvocationIndex].due = g_buffer.a[gl_LocalInvocationIndex].ene;" NL
			"  groupMemoryBarrier();" NL "  barrier();" NL "  g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].like = "
			"g_buffer.a[(gl_LocalInvocationIndex + 1u) % 128u].due;" NL "  groupMemoryBarrier();" NL "  barrier();" NL
			"  g_buffer.a[(gl_LocalInvocationIndex + 17u) % 128u].fake "
			"= g_buffer.a[(gl_LocalInvocationIndex + 17u) % "
			"128u].like;" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		GLint data[128 * 4];
		for (int i = 0; i < 128; ++i)
		{
			data[i * 4]		= i + 256;
			data[i * 4 + 1] = 0;
			data[i * 4 + 2] = 0;
			data[i * 4 + 3] = 0;
		}
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLint* out_data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		for (int i = 0; i < 128; ++i)
		{
			if (out_data[i * 4 + 3] != data[i * 4])
			{
				Output("Received: %d, but expected: %d -> %d -> %d\n", out_data[i * 4 + 3], data[i * 4],
					   out_data[i * 4 + 1], out_data[i * 4 + 2]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		for (int i = 0; i < 128; ++i)
		{
			data[i * 4]		= i + 512;
			data[i * 4 + 1] = 0;
			data[i * 4 + 2] = 0;
			data[i * 4 + 3] = 0;
		}
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		out_data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		for (int i = 0; i < 128; ++i)
		{
			if (out_data[i * 4 + 3] != data[i * 4])
			{
				Output("Received: %d, but expected: %d\n", out_data[i * 4 + 3], data[i * 4]);
				status = false;
			}
		}
		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}